

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_with_seed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  undefined4 in_EDX;
  char *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  
  farmhash32_nt_with_seed(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  uVar1 = debug_tweak32(0);
  return uVar1;
}

Assistant:

uint32_t farmhash32_with_seed(const char* s, size_t len, uint32_t seed) {
  return debug_tweak32(

#if CAN_USE_SSE41 && x86_64
      farmhash32_nt_with_seed(s, len, seed)
#elif CAN_USE_SSE42 && CAN_USE_AESNI
      farmhash32_su_with_seed(s, len, seed)
#elif CAN_USE_SSE41 && CAN_USE_SSE42
      farmhash32_sa_with_seed(s, len, seed)
#else
      farmhash32_mk_with_seed(s, len, seed)
#endif

  );
}